

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackPrimitiveTypeCase::getNumTessellatedPrimitives
          (FeedbackPrimitiveTypeCase *this)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  uint uVar3;
  
  uVar3 = (uint)this;
  if (in_ESI == 1) {
    if (uVar3 == 2) {
      return 0xc;
    }
    if (uVar3 == 1) {
      return 0x10;
    }
    if (uVar3 == 0) {
      iVar1 = 3;
      iVar2 = 9;
      do {
        if (iVar1 == 0) {
          iVar1 = 1;
LAB_0159dcd4:
          return iVar1 + (int)this;
        }
        if (iVar1 == 1) {
          iVar1 = 3;
          goto LAB_0159dcd4;
        }
        iVar1 = iVar1 + -2;
        this = (FeedbackPrimitiveTypeCase *)(ulong)(uint)((int)this + iVar2);
        iVar2 = iVar2 + -6;
      } while( true );
    }
  }
  else if ((in_ESI == 0) && (uVar3 < 3)) {
    return *(int *)(&DAT_01c73cf8 + ((ulong)this & 0xffffffff) * 4);
  }
  return -1;
}

Assistant:

int FeedbackPrimitiveTypeCase::getNumTessellatedPrimitives (void) const
{
	const int tessellationLevel = 3;

	if (m_tessellationPointMode == TESSELLATION_POINTMODE_OFF)
	{
		if (m_tessellationOutput == TESSELLATION_OUT_TRIANGLES)
			return getTriangleNumOutputPrimitives(tessellationLevel);
		else if (m_tessellationOutput == TESSELLATION_OUT_QUADS)
			return tessellationLevel * tessellationLevel * 2; // tessellated as triangles
		else if (m_tessellationOutput == TESSELLATION_OUT_ISOLINES)
			return tessellationLevel * tessellationLevel;
	}
	else if (m_tessellationPointMode == TESSELLATION_POINTMODE_ON)
	{
		if (m_tessellationOutput == TESSELLATION_OUT_TRIANGLES)
			return getTriangleNumOutputPrimitivesPoints(tessellationLevel);
		else if (m_tessellationOutput == TESSELLATION_OUT_QUADS)
			return (tessellationLevel + 1) * (tessellationLevel + 1);
		else if (m_tessellationOutput == TESSELLATION_OUT_ISOLINES)
			return tessellationLevel * (tessellationLevel + 1);
	}

	DE_ASSERT(false);
	return -1;
}